

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_analyze.hpp
# Opt level: O0

idx_t duckdb::AlpFinalAnalyze<float>(AnalyzeState *state)

{
  bool bVar1;
  AlpAnalyzeState<float> *this;
  size_type sVar2;
  ulong uVar3;
  AlpAnalyzeState<float> *in_RDI;
  idx_t final_analyze_size;
  idx_t factor_of_sampling;
  vector<float,_true> *vector_to_compress;
  iterator __end0;
  iterator __begin0;
  vector<duckdb::vector<float,_true>,_true> *__range2;
  idx_t compressed_values;
  AlpAnalyzeState<float> *analyze_state;
  State *in_stack_00000108;
  vector<duckdb::vector<float,_true>,_true> *in_stack_00000110;
  vector<duckdb::vector<float,_true>,_std::allocator<duckdb::vector<float,_true>_>_>
  *in_stack_ffffffffffffffa8;
  AlpAnalyzeState<float> *in_stack_ffffffffffffffb0;
  __normal_iterator<duckdb::vector<float,_true>_*,_std::vector<duckdb::vector<float,_true>,_std::allocator<duckdb::vector<float,_true>_>_>_>
  local_30;
  vector<duckdb::vector<float,_true>,_true> *local_28;
  ulong local_20;
  AlpAnalyzeState<float> *local_18;
  idx_t local_8;
  
  local_18 = in_RDI;
  alp::AlpCompression<float,_true>::FindTopKCombinations(in_stack_00000110,in_stack_00000108);
  local_20 = 0;
  local_28 = &local_18->complete_vectors_sampled;
  local_30._M_current =
       (vector<float,_true> *)
       ::std::vector<duckdb::vector<float,_true>,_std::allocator<duckdb::vector<float,_true>_>_>::
       begin(in_stack_ffffffffffffffa8);
  ::std::vector<duckdb::vector<float,_true>,_std::allocator<duckdb::vector<float,_true>_>_>::end
            (in_stack_ffffffffffffffa8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<duckdb::vector<float,_true>_*,_std::vector<duckdb::vector<float,_true>,_std::allocator<duckdb::vector<float,_true>_>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<duckdb::vector<float,_true>_*,_std::vector<duckdb::vector<float,_true>,_std::allocator<duckdb::vector<float,_true>_>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (!bVar1) break;
    this = (AlpAnalyzeState<float> *)
           __gnu_cxx::
           __normal_iterator<duckdb::vector<float,_true>_*,_std::vector<duckdb::vector<float,_true>,_std::allocator<duckdb::vector<float,_true>_>_>_>
           ::operator*(&local_30);
    in_stack_ffffffffffffffa8 =
         (vector<duckdb::vector<float,_true>,_std::allocator<duckdb::vector<float,_true>_>_> *)
         ::std::vector<float,_std::allocator<float>_>::data
                   ((vector<float,_std::allocator<float>_> *)0x9ee630);
    ::std::vector<float,_std::allocator<float>_>::size
              ((vector<float,_std::allocator<float>_> *)this);
    alp::AlpCompression<float,_true>::Compress
              ((float *)in_stack_ffffffffffffffb0,(idx_t)in_stack_ffffffffffffffa8,(State *)0x9ee653
              );
    bVar1 = AlpAnalyzeState<float>::HasEnoughSpace(this);
    if (!bVar1) {
      AlpAnalyzeState<float>::FlushSegment(local_18);
    }
    AlpAnalyzeState<float>::FlushVector(in_stack_ffffffffffffffb0);
    sVar2 = ::std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)this);
    local_20 = sVar2 + local_20;
    __gnu_cxx::
    __normal_iterator<duckdb::vector<float,_true>_*,_std::vector<duckdb::vector<float,_true>,_std::allocator<duckdb::vector<float,_true>_>_>_>
    ::operator++(&local_30);
  }
  AlpAnalyzeState<float>::FlushSegment(local_18);
  if (local_20 == 0) {
    local_8 = 0xffffffffffffffff;
  }
  else {
    uVar3 = local_18->total_values_count / local_20;
    local_8 = AlpAnalyzeState<float>::TotalUsedBytes((AlpAnalyzeState<float> *)0x9ee6d6);
    local_8 = local_8 * uVar3;
  }
  return local_8;
}

Assistant:

idx_t AlpFinalAnalyze(AnalyzeState &state) {
	auto &analyze_state = (AlpAnalyzeState<T> &)state;

	// Finding the Top K combinations of Exponent and Factor
	alp::AlpCompression<T, true>::FindTopKCombinations(analyze_state.rowgroup_sample, analyze_state.state);

	// Encode the entire sampled vectors to estimate a compression size
	idx_t compressed_values = 0;
	for (auto &vector_to_compress : analyze_state.complete_vectors_sampled) {
		alp::AlpCompression<T, true>::Compress(vector_to_compress.data(), vector_to_compress.size(),
		                                       analyze_state.state);
		if (!analyze_state.HasEnoughSpace()) {
			analyze_state.FlushSegment();
		}
		analyze_state.FlushVector();
		compressed_values += vector_to_compress.size();
	}

	// Flush last unfinished segment
	analyze_state.FlushSegment();

	if (compressed_values == 0) {
		return DConstants::INVALID_INDEX;
	}

	// We estimate the size by taking into account the portion of the values we took
	const auto factor_of_sampling = analyze_state.total_values_count / compressed_values;
	const auto final_analyze_size = analyze_state.TotalUsedBytes() * factor_of_sampling;
	return final_analyze_size; // return size of data in bytes
}